

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-line.cpp
# Opt level: O2

void __thiscall wasm::Options::Options(Options *this,string *command,string *description)

{
  _Rb_tree_header *p_Var1;
  char *types;
  string *this_00;
  undefined8 *puVar2;
  undefined1 local_120 [8];
  string GeneralOption;
  string local_d8 [32];
  string local_b8;
  string local_98;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  
  this->debug = false;
  p_Var1 = &(this->extra)._M_t._M_impl.super__Rb_tree_header;
  (this->extra)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->extra)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->extra)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->extra)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->extra)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->options).super__Vector_base<wasm::Options::Option,_std::allocator<wasm::Options::Option>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->options).super__Vector_base<wasm::Options::Option,_std::allocator<wasm::Options::Option>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->options).super__Vector_base<wasm::Options::Option,_std::allocator<wasm::Options::Option>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->positional = Zero;
  (this->positionalName)._M_dataplus._M_p = (pointer)&(this->positionalName).field_2;
  (this->positionalName)._M_string_length = 0;
  (this->positionalName).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&(this->positionalAction).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->positionalAction).super__Function_base._M_functor + 8) = 0;
  (this->positionalAction).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->positionalAction)._M_invoker = (_Invoker_type)0x0;
  (this->categories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->categories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->categories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_120,"General options",
             (allocator<char> *)(GeneralOption.field_2._M_local_buf + 8));
  types = getenv("BINARYEN_DEBUG");
  if (types != (char *)0x0) {
    setDebugEnabled(types);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(GeneralOption.field_2._M_local_buf + 8),"--version",&local_32);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"",&local_31);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Output version information and exit",&local_33);
  std::__cxx11::string::string((string *)local_78._M_pod_data,(string *)command);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string(this_00,(string *)local_78._M_pod_data);
  pcStack_40 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/command-line.cpp:76:7)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/command-line.cpp:76:7)>
             ::_M_manager;
  local_58._M_unused._0_8_ = (undefined8)this_00;
  add(this,(string *)((long)&GeneralOption.field_2 + 8),&local_b8,&local_98,(string *)local_120,Zero
      ,(Action *)&local_58,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::__cxx11::string::~string((string *)local_78._M_pod_data);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)(GeneralOption.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"--help",&local_32);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"-h",&local_31);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58._M_pod_data,"Show this help message and exit",&local_33);
  GeneralOption.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&stack0xffffffffffffff08,(string *)command);
  std::__cxx11::string::string(local_d8,(string *)description);
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  puVar2 = (undefined8 *)operator_new(0x48);
  *puVar2 = GeneralOption.field_2._8_8_;
  std::__cxx11::string::string((string *)(puVar2 + 1),(string *)&stack0xffffffffffffff08);
  std::__cxx11::string::string((string *)(puVar2 + 5),local_d8);
  pcStack_60 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/command-line.cpp:85:7)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/command-line.cpp:85:7)>
             ::_M_manager;
  local_78._M_unused._M_object = puVar2;
  add(this,&local_b8,&local_98,(string *)&local_58,(string *)local_120,Zero,(Action *)&local_78,
      false);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  Options(std::__cxx11::string_const&,std::__cxx11::string_const&)::$_1::~__1
            ((__1 *)(GeneralOption.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_58._M_pod_data);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(GeneralOption.field_2._M_local_buf + 8),"--debug",
             (allocator<char> *)local_78._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"-d",&local_32);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Print debug information to stderr",&local_31);
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/command-line.cpp:139:7)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/command-line.cpp:139:7)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  add(this,(string *)((long)&GeneralOption.field_2 + 8),&local_b8,&local_98,(string *)local_120,
      Optional,(Action *)&local_58,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)(GeneralOption.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_120);
  return;
}

Assistant:

Options::Options(const std::string& command, const std::string& description)
  : debug(false), positional(Arguments::Zero) {
  std::string GeneralOption = "General options";

  if (getenv("BINARYEN_DEBUG")) {
    setDebugEnabled(getenv("BINARYEN_DEBUG"));
  }

  add("--version",
      "",
      "Output version information and exit",
      GeneralOption,
      Arguments::Zero,
      [command](Options*, const std::string&) {
        std::cout << command << " version " << PROJECT_VERSION << '\n';
        exit(0);
      });
  add("--help",
      "-h",
      "Show this help message and exit",
      GeneralOption,
      Arguments::Zero,
      [this, command, description](Options* o, const std::string&) {
        for (size_t i = 0; i < SCREEN_WIDTH; i++) {
          std::cout << '=';
        }
        std::cout << '\n';
        std::cout << command;
        if (positional != Arguments::Zero) {
          std::cout << ' ' << positionalName;
        }
        std::cout << "\n\n";
        printWrap(std::cout, 0, description);
        std::cout << '\n';
        for (size_t i = 0; i < SCREEN_WIDTH; i++) {
          std::cout << '=';
        }
        std::cout << '\n';
        size_t optionWidth = 0;
        for (const auto& o : options) {
          if (o.hidden) {
            continue;
          }
          optionWidth =
            std::max(optionWidth, o.longName.size() + o.shortName.size());
        }
        for (int i = int(categories.size()) - 1; i >= 0; i--) {
          auto& category = categories[i];
          std::cout << "\n\n" << category << ":\n";
          for (size_t i = 0; i < category.size() + 1; i++) {
            std::cout << '-';
          }
          std::cout << '\n';
          for (const auto& o : options) {
            if (o.hidden || o.category != category) {
              continue;
            }
            std::cout << '\n';
            bool long_n_short =
              o.longName.size() != 0 && o.shortName.size() != 0;
            size_t pad =
              1 + optionWidth - o.longName.size() - o.shortName.size();
            std::cout << "  " << o.longName << (long_n_short ? ',' : ' ')
                      << o.shortName << std::string(pad, ' ');
            printWrap(std::cout, optionWidth + 4, o.description);
            std::cout << '\n';
          }
        }
        std::cout << '\n';
        exit(EXIT_SUCCESS);
      });
  add("--debug",
      "-d",
      "Print debug information to stderr",
      GeneralOption,
      Arguments::Optional,
      [&](Options* o, const std::string& arguments) {
        debug = true;
        setDebugEnabled(arguments.c_str());
      });
}